

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O0

void __thiscall tcu::ThreadUtil::Thread::pushMessage(Thread *this,string *str)

{
  deUint64 time;
  char *message;
  Message local_48;
  ScopedLock local_20;
  ScopedLock lock;
  string *str_local;
  Thread *this_local;
  
  lock.m_mutex = (Mutex *)str;
  de::ScopedLock::ScopedLock(&local_20,&this->m_messageLock);
  time = deGetMicroseconds();
  message = (char *)std::__cxx11::string::c_str();
  Message::Message(&local_48,time,message);
  std::vector<tcu::ThreadUtil::Message,_std::allocator<tcu::ThreadUtil::Message>_>::push_back
            (&this->m_messages,&local_48);
  Message::~Message(&local_48);
  de::ScopedLock::~ScopedLock(&local_20);
  return;
}

Assistant:

void Thread::pushMessage (const std::string& str)
{
	de::ScopedLock lock(m_messageLock);
	m_messages.push_back(Message(deGetMicroseconds(), str.c_str()));
}